

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

Iterator __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::find(ChannelGroupManifest *this,uint64_t idValue)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  
  p_Var2 = (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  iVar1._M_node = &(this->_table)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar3._M_node = iVar1._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var2 + 1) >= idValue) {
        iVar3._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < idValue];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((iVar3._M_node != iVar1._M_node) && (*(ulong *)(iVar3._M_node + 1) <= idValue)) {
      iVar1._M_node = iVar3._M_node;
    }
  }
  return (Iterator)iVar1._M_node;
}

Assistant:

IDManifest::ChannelGroupManifest::Iterator
IDManifest::ChannelGroupManifest::find (uint64_t idValue)
{
    return IDManifest::ChannelGroupManifest::Iterator (_table.find (idValue));
}